

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O1

uint32_t crc32(void *data,size_t n)

{
  uint uVar1;
  size_t sVar2;
  
  if (n != 0) {
    uVar1 = 0xffffffff;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ crc32_table[(byte)((byte)uVar1 ^ *(byte *)((long)data + sVar2))];
      sVar2 = sVar2 + 1;
    } while (n != sVar2);
    return ~uVar1;
  }
  return 0;
}

Assistant:

uint32_t
crc32(const void* data, size_t n)
{
    const uint8_t* bytes = (const uint8_t*) data;
    uint32_t crcreg = CRC32_INITXOR;
    int i;

    for(i = 0; i < n; i++)
        crcreg = (crcreg >> 8) ^ crc32_table[((crcreg ^ bytes[i]) & 0xffU)];

    return crcreg ^ CRC32_FINALXOR;
}